

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadInt16(ON_BinaryArchive *this,size_t count,ON__INT16 *p)

{
  ushort *puVar1;
  bool bVar2;
  size_t sVar3;
  
  bVar2 = ReadByte(this,count * 2,p);
  if ((bVar2) && (this->m_endian == big_endian)) {
    for (sVar3 = 0; count != sVar3; sVar3 = sVar3 + 1) {
      puVar1 = (ushort *)(p + sVar3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    }
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::ReadInt16( // Read an array of 16 bit integers
		size_t count,            // number of unsigned integers to read
		ON__INT16* p
		)
{
  bool rc = ReadByte( count<<1, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
    // reverse byte order
		unsigned char* b= (unsigned char*) (p);
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[1]; b[1] = c;
			b += 2;
		}
  }
  return rc;
}